

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

void __thiscall soinn::ESOINN::load(ESOINN *this,string *filename)

{
  nvp<soinn::ESOINN> local_2b8;
  xml_iarchive ia;
  ifstream ifs;
  
  clear(this);
  std::ifstream::ifstream((istream *)&ifs,(filename->_M_dataplus)._M_p,_S_in);
  boost::archive::xml_iarchive::xml_iarchive(&ia,(istream *)&ifs,0);
  local_2b8.n_ = "*const_cast<ESOINN*>(this)";
  local_2b8.v_ = this;
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<soinn::ESOINN>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)&ia,&local_2b8);
  boost::archive::xml_iarchive_impl<boost::archive::xml_iarchive>::~xml_iarchive_impl
            (&ia.super_xml_iarchive_impl<boost::archive::xml_iarchive>);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void ESOINN::load(std::string filename)
{
    clear();
    std::ifstream ifs(filename.c_str());
    boost::archive::xml_iarchive ia(ifs);
    ia >> BOOST_SERIALIZATION_NVP(*const_cast<ESOINN*>(this));
}